

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_hasUnlinkedUnitsWhenVariableHasNoUnits_Test::
~Units_hasUnlinkedUnitsWhenVariableHasNoUnits_Test
          (Units_hasUnlinkedUnitsWhenVariableHasNoUnits_Test *this)

{
  Units_hasUnlinkedUnitsWhenVariableHasNoUnits_Test *this_local;
  
  ~Units_hasUnlinkedUnitsWhenVariableHasNoUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsWhenVariableHasNoUnits)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    c1->addVariable(v1);
    m->addComponent(c1);

    EXPECT_FALSE(m->hasUnlinkedUnits());
}